

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::listen_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,listen_failed_alert *this)

{
  undefined8 uVar1;
  error_category *peVar2;
  char *pcVar3;
  int in_ECX;
  char *pcVar4;
  string local_1c8;
  string local_1a8;
  string local_188;
  char ret [300];
  
  print_endpoint_abi_cxx11_
            (&local_1a8,(libtorrent *)&this->address,(address *)(ulong)(uint)this->port,in_ECX);
  pcVar3 = listen_interface(this);
  if ((ulong)this->op < 0x2b) {
    pcVar4 = operation_name::names[this->op];
  }
  else {
    pcVar4 = "unknown operation";
  }
  uVar1 = *(undefined8 *)
           ((anonymous_namespace)::sock_type_str(libtorrent::socket_type_t)::type_str +
           (ulong)this->socket_type * 8);
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&local_1c8,peVar2,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_188,&local_1c8);
  snprintf(ret,300,"listening on %s (device: %s) failed: [%s] [%s] %s",local_1a8._M_dataplus._M_p,
           pcVar3,pcVar4,uVar1,local_188._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,ret,(allocator<char> *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string listen_failed_alert::message() const
	{
		char ret[300];
		std::snprintf(ret, sizeof(ret), "listening on %s (device: %s) failed: [%s] [%s] %s"
			, print_endpoint(address, port).c_str()
			, listen_interface()
			, operation_name(op)
			, sock_type_str(socket_type)
			, convert_from_native(error.message()).c_str());
		return ret;
	}